

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O1

SC_Man * Abc_SclManStart(SC_Lib *pLib,Abc_Ntk_t *pNtk,int fUseWireLoads,int fDept,float DUser,
                        int nTreeCRatio)

{
  size_t __size;
  int iVar1;
  int *piVar2;
  long *plVar3;
  long lVar4;
  char *__s;
  SC_Man *p;
  SC_Pair *pSVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Flt_t *pVVar8;
  float *pfVar9;
  Vec_Que_t *pVVar10;
  Vec_Wec_t *pVVar11;
  SC_WireLoad *pSVar12;
  char *__dest;
  int iVar13;
  uint uVar14;
  Vec_Ptr_t *pVVar15;
  long lVar16;
  size_t sVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  float fVar24;
  float fVar25;
  
  if (pLib->unit_time != 0xc) {
    __assert_fail("pLib->unit_time == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclSize.h"
                  ,0x98,"SC_Man *Abc_SclManAlloc(SC_Lib *, Abc_Ntk_t *)");
  }
  if (pLib->unit_cap_snd != 0xf) {
    __assert_fail("pLib->unit_cap_snd == 15",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclSize.h"
                  ,0x99,"SC_Man *Abc_SclManAlloc(SC_Lib *, Abc_Ntk_t *)");
  }
  if (pNtk->ntkFunc != ABC_FUNC_MAP) {
    __assert_fail("Abc_NtkHasMapping(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclSize.h"
                  ,0x9a,"SC_Man *Abc_SclManAlloc(SC_Lib *, Abc_Ntk_t *)");
  }
  p = (SC_Man *)calloc(1,0x130);
  p->pLib = pLib;
  p->pNtk = pNtk;
  iVar1 = pNtk->vObjs->nSize;
  p->nObjs = iVar1;
  sVar17 = (size_t)iVar1;
  pSVar5 = (SC_Pair *)calloc(sVar17,8);
  p->pLoads = pSVar5;
  pSVar5 = (SC_Pair *)calloc(sVar17,8);
  p->pDepts = pSVar5;
  pSVar5 = (SC_Pair *)calloc(sVar17,8);
  p->pTimes = pSVar5;
  pSVar5 = (SC_Pair *)calloc(sVar17,8);
  p->pSlews = pSVar5;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar13 = iVar1;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar13;
  if (iVar13 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar13 << 2);
  }
  pVVar6->pArray = piVar7;
  pVVar6->nSize = iVar1;
  if (piVar7 != (int *)0x0) {
    memset(piVar7,0,sVar17 << 2);
  }
  p->vBestFans = pVVar6;
  pVVar15 = pNtk->vCos;
  iVar1 = pVVar15->nSize;
  pVVar8 = (Vec_Flt_t *)malloc(0x10);
  iVar13 = iVar1;
  if (iVar1 - 1U < 0xf) {
    iVar13 = 0x10;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar13;
  if (iVar13 == 0) {
    pfVar9 = (float *)0x0;
  }
  else {
    pfVar9 = (float *)malloc((long)iVar13 << 2);
  }
  pVVar8->pArray = pfVar9;
  pVVar8->nSize = iVar1;
  memset(pfVar9,0,(long)iVar1 << 2);
  p->vTimesOut = pVVar8;
  uVar19 = pVVar15->nSize;
  pVVar10 = (Vec_Que_t *)calloc(1,0x20);
  uVar14 = 0x10;
  if (0x10 < (int)uVar19) {
    uVar14 = uVar19;
  }
  pVVar10->nSize = 1;
  pVVar10->nCap = uVar14 + 1;
  sVar17 = (ulong)uVar14 * 4 + 4;
  piVar7 = (int *)malloc(sVar17);
  memset(piVar7,0xff,sVar17);
  pVVar10->pHeap = piVar7;
  piVar7 = (int *)malloc(sVar17);
  memset(piVar7,0xff,sVar17);
  pVVar10->pOrder = piVar7;
  p->vQue = pVVar10;
  if (pVVar10->pCostsFlt == (float **)0x0) {
    pVVar10->pCostsFlt = &pVVar8->pArray;
    if (0 < pVVar15->nSize) {
      uVar23 = 0;
      do {
        iVar1 = pVVar10->nCap;
        if (iVar1 <= pVVar10->nSize) {
          iVar18 = pVVar10->nSize + 1;
          iVar13 = iVar1 * 2;
          if (iVar18 == iVar13 || SBORROW4(iVar18,iVar13) != iVar18 + iVar1 * -2 < 0) {
            iVar18 = iVar13;
          }
          if (iVar1 < iVar18) {
            lVar22 = (long)iVar18;
            sVar17 = lVar22 * 4;
            if (pVVar10->pHeap == (int *)0x0) {
              piVar7 = (int *)malloc(sVar17);
            }
            else {
              piVar7 = (int *)realloc(pVVar10->pHeap,sVar17);
            }
            pVVar10->pHeap = piVar7;
            if (pVVar10->pOrder == (int *)0x0) {
              piVar7 = (int *)malloc(sVar17);
            }
            else {
              piVar7 = (int *)realloc(pVVar10->pOrder,sVar17);
            }
            pVVar10->pOrder = piVar7;
            memset(pVVar10->pHeap + pVVar10->nCap,0xff,(lVar22 - pVVar10->nCap) * 4);
            memset(pVVar10->pOrder + pVVar10->nCap,0xff,(lVar22 - pVVar10->nCap) * 4);
            pVVar10->nCap = iVar18;
          }
        }
        iVar1 = pVVar10->nCap;
        iVar13 = (int)uVar23;
        if ((long)iVar1 <= (long)uVar23) {
          uVar19 = iVar1 * 2;
          uVar14 = iVar13 + 1;
          if (uVar14 != uVar19 && SBORROW4(uVar14,uVar19) == (int)(uVar14 + iVar1 * -2) < 0) {
            uVar19 = uVar14;
          }
          if (iVar1 < (int)uVar19) {
            sVar17 = (ulong)uVar19 * 4;
            if (pVVar10->pHeap == (int *)0x0) {
              piVar7 = (int *)malloc(sVar17);
            }
            else {
              piVar7 = (int *)realloc(pVVar10->pHeap,sVar17);
            }
            pVVar10->pHeap = piVar7;
            sVar17 = (ulong)uVar19 << 2;
            if (pVVar10->pOrder == (int *)0x0) {
              piVar7 = (int *)malloc(sVar17);
            }
            else {
              piVar7 = (int *)realloc(pVVar10->pOrder,sVar17);
            }
            pVVar10->pOrder = piVar7;
            memset(pVVar10->pHeap + pVVar10->nCap,0xff,((long)(int)uVar19 - (long)pVVar10->nCap) * 4
                  );
            memset(pVVar10->pOrder + pVVar10->nCap,0xff,
                   ((long)(int)uVar19 - (long)pVVar10->nCap) * 4);
            pVVar10->nCap = uVar19;
          }
        }
        iVar1 = pVVar10->nSize;
        if (pVVar10->nCap <= iVar1) {
          __assert_fail("p->nSize < p->nCap",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                        ,0xe3,"void Vec_QuePush(Vec_Que_t *, int)");
        }
        piVar7 = pVVar10->pOrder;
        if (piVar7[uVar23] != -1) {
          __assert_fail("p->pOrder[v] == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                        ,0xe4,"void Vec_QuePush(Vec_Que_t *, int)");
        }
        piVar2 = pVVar10->pHeap;
        if (piVar2[iVar1] != -1) {
          __assert_fail("p->pHeap[p->nSize] == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                        ,0xe5,"void Vec_QuePush(Vec_Que_t *, int)");
        }
        piVar7[uVar23] = iVar1;
        iVar1 = pVVar10->nSize;
        pVVar10->nSize = iVar1 + 1;
        piVar2[iVar1] = iVar13;
        pfVar9 = *pVVar10->pCostsFlt;
        if (pfVar9 == (float *)0x0) {
          fVar24 = (float)iVar13;
        }
        else {
          fVar24 = pfVar9[uVar23];
        }
        uVar19 = piVar7[uVar23];
        uVar20 = (ulong)(int)uVar19;
        if (uVar20 == 0xffffffffffffffff) {
          __assert_fail("p->pOrder[v] != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                        ,0xa5,"int Vec_QueMoveUp(Vec_Que_t *, int)");
        }
        if (uVar23 != (uint)piVar2[uVar20]) {
          __assert_fail("p->pHeap[i] == v",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                        ,0xa6,"int Vec_QueMoveUp(Vec_Que_t *, int)");
        }
        if (1 < (int)uVar19) {
          do {
            uVar14 = (uint)uVar20;
            uVar21 = uVar20 >> 1 & 0x7fffffff;
            iVar1 = piVar2[uVar21];
            if (pfVar9 == (float *)0x0) {
              fVar25 = (float)iVar1;
            }
            else {
              fVar25 = pfVar9[iVar1];
            }
            uVar19 = uVar14;
            if (fVar24 <= fVar25) break;
            piVar2[uVar20 & 0xffffffff] = iVar1;
            piVar7[iVar1] = uVar14;
            uVar20 = uVar21;
            uVar19 = (uint)uVar21;
          } while (3 < uVar14);
        }
        piVar2[(int)uVar19] = iVar13;
        piVar7[uVar23] = uVar19;
        uVar23 = uVar23 + 1;
      } while ((long)uVar23 < (long)pNtk->vCos->nSize);
    }
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = 1000;
    pVVar6->nSize = 0;
    piVar7 = (int *)malloc(4000);
    pVVar6->pArray = piVar7;
    p->vUpdates = pVVar6;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = 1000;
    pVVar6->nSize = 0;
    piVar7 = (int *)malloc(4000);
    pVVar6->pArray = piVar7;
    p->vUpdates2 = pVVar6;
    pVVar8 = (Vec_Flt_t *)malloc(0x10);
    pVVar8->nCap = 1000;
    pVVar8->nSize = 0;
    pfVar9 = (float *)malloc(4000);
    pVVar8->pArray = pfVar9;
    p->vLoads2 = pVVar8;
    pVVar8 = (Vec_Flt_t *)malloc(0x10);
    pVVar8->nCap = 1000;
    pVVar8->nSize = 0;
    pfVar9 = (float *)malloc(4000);
    pVVar8->pArray = pfVar9;
    p->vLoads3 = pVVar8;
    pVVar8 = (Vec_Flt_t *)malloc(0x10);
    pVVar8->nCap = 1000;
    pVVar8->nSize = 0;
    pfVar9 = (float *)malloc(4000);
    pVVar8->pArray = pfVar9;
    p->vTimes2 = pVVar8;
    pVVar8 = (Vec_Flt_t *)malloc(0x10);
    pVVar8->nCap = 1000;
    pVVar8->nSize = 0;
    pfVar9 = (float *)malloc(4000);
    pVVar8->pArray = pfVar9;
    p->vTimes3 = pVVar8;
    uVar19 = p->nObjs;
    pVVar8 = (Vec_Flt_t *)malloc(0x10);
    uVar14 = 0x10;
    if (0xe < uVar19 - 1) {
      uVar14 = uVar19;
    }
    pVVar8->nSize = 0;
    pVVar8->nCap = uVar14;
    lVar22 = (long)(int)uVar14;
    if (uVar14 == 0) {
      pfVar9 = (float *)0x0;
    }
    else {
      pfVar9 = (float *)malloc(lVar22 * 4);
    }
    pVVar8->pArray = pfVar9;
    pVVar8->nSize = uVar19;
    sVar17 = (long)(int)uVar19 << 2;
    piVar7 = (int *)0x0;
    memset(pfVar9,0,sVar17);
    p->vNode2Gain = pVVar8;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nSize = 0;
    pVVar6->nCap = uVar14;
    if (uVar14 != 0) {
      piVar7 = (int *)malloc(lVar22 * 4);
    }
    pVVar6->pArray = piVar7;
    pVVar6->nSize = uVar19;
    if (piVar7 != (int *)0x0) {
      memset(piVar7,0,sVar17);
    }
    p->vNode2Gate = pVVar6;
    pVVar10 = (Vec_Que_t *)calloc(1,0x20);
    uVar23 = 0x10;
    if (0x10 < (int)uVar19) {
      uVar23 = (ulong)uVar19;
    }
    pVVar10->nSize = 1;
    pVVar10->nCap = (int)uVar23 + 1;
    __size = uVar23 * 4 + 4;
    piVar7 = (int *)malloc(__size);
    memset(piVar7,0xff,__size);
    pVVar10->pHeap = piVar7;
    piVar7 = (int *)malloc(__size);
    memset(piVar7,0xff,__size);
    pVVar10->pOrder = piVar7;
    p->vNodeByGain = pVVar10;
    if (pVVar10->pCostsFlt == (float **)0x0) {
      pVVar10->pCostsFlt = &pVVar8->pArray;
      pVVar6 = (Vec_Int_t *)malloc(0x10);
      pVVar6->nSize = 0;
      pVVar6->nCap = uVar14;
      if (uVar14 == 0) {
        piVar7 = (int *)0x0;
      }
      else {
        piVar7 = (int *)malloc(lVar22 << 2);
      }
      pVVar6->pArray = piVar7;
      pVVar6->nSize = uVar19;
      if (piVar7 != (int *)0x0) {
        memset(piVar7,0xff,sVar17);
      }
      p->vNodeIter = pVVar6;
      iVar18 = Abc_NtkLevel(pNtk);
      iVar1 = iVar18 * 2 + 1;
      pVVar11 = (Vec_Wec_t *)malloc(0x10);
      iVar13 = 8;
      if (6 < (uint)(iVar18 * 2)) {
        iVar13 = iVar1;
      }
      pVVar11->nSize = 0;
      pVVar11->nCap = iVar13;
      pVVar6 = (Vec_Int_t *)calloc((long)iVar13,0x10);
      pVVar11->pArray = pVVar6;
      pVVar11->nSize = iVar1;
      p->vLevels = pVVar11;
      pVVar6 = (Vec_Int_t *)malloc(0x10);
      pVVar6->nCap = 100;
      pVVar6->nSize = 0;
      piVar7 = (int *)malloc(400);
      pVVar6->pArray = piVar7;
      p->vChanged = pVVar6;
      pVVar15 = pNtk->vCos;
      if (0 < pVVar15->nSize) {
        lVar22 = 0;
        do {
          plVar3 = (long *)pVVar15->pArray[lVar22];
          *(uint *)((long)plVar3 + 0x14) =
               (*(uint *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                   (long)*(int *)plVar3[4] * 8) + 0x14) & 0xfffff000) +
               (*(uint *)((long)plVar3 + 0x14) & 0xfff) + 0x1000;
          lVar22 = lVar22 + 1;
          pVVar15 = pNtk->vCos;
        } while (lVar22 < pVVar15->nSize);
      }
      pVVar15 = pNtk->vCis;
      if (0 < pVVar15->nSize) {
        lVar22 = 0;
        do {
          *(int *)((long)pVVar15->pArray[lVar22] + 0x38) = (int)lVar22;
          lVar22 = lVar22 + 1;
          pVVar15 = pNtk->vCis;
        } while (lVar22 < pVVar15->nSize);
      }
      pVVar15 = pNtk->vCos;
      if (0 < pVVar15->nSize) {
        lVar22 = 0;
        do {
          *(int *)((long)pVVar15->pArray[lVar22] + 0x38) = (int)lVar22;
          lVar22 = lVar22 + 1;
          pVVar15 = pNtk->vCos;
        } while (lVar22 < pVVar15->nSize);
      }
      if (nTreeCRatio != 0) {
        p->EstLoadMax = (float)nTreeCRatio * 0.01;
        p->EstLinear = 100.0;
      }
      Abc_SclMioGates2SclGates(pLib,pNtk);
      Abc_SclManReadSlewAndLoad(p,pNtk);
      if (fUseWireLoads != 0) {
        if (pNtk->pWLoadUsed == (char *)0x0) {
          pVVar15 = p->pNtk->vObjs;
          lVar22 = (long)pVVar15->nSize;
          if (lVar22 < 1) {
            fVar24 = 0.0;
          }
          else {
            fVar24 = 0.0;
            lVar16 = 0;
            do {
              plVar3 = (long *)pVVar15->pArray[lVar16];
              if ((((plVar3 != (long *)0x0) && ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 7)) &&
                  (*(int *)((long)plVar3 + 0x1c) != 0)) &&
                 (((lVar4 = *plVar3, *(int *)((long)plVar3 + 0x1c) != 1 ||
                   (*(int *)(lVar4 + 4) != 4)) || (plVar3[7] != 0)))) {
                iVar1 = (int)plVar3[2];
                if (((long)iVar1 < 0) || (*(int *)(*(long *)(lVar4 + 0x178) + 4) <= iVar1)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                iVar1 = *(int *)(*(long *)(*(long *)(lVar4 + 0x178) + 8) + (long)iVar1 * 4);
                if (((long)iVar1 < 0) || (*(int *)(*(long *)(lVar4 + 0x170) + 100) <= iVar1)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                fVar24 = fVar24 + *(float *)(*(long *)(*(long *)(*(long *)(lVar4 + 0x170) + 0x68) +
                                                      (long)iVar1 * 8) + 0x18);
              }
              lVar16 = lVar16 + 1;
            } while (lVar22 != lVar16);
          }
          pSVar12 = Abc_SclFindWireLoadModel(pLib,fVar24);
          p->pWLoadUsed = pSVar12;
          if (pSVar12 != (SC_WireLoad *)0x0) {
            __s = pSVar12->pName;
            if (__s == (char *)0x0) {
              __dest = (char *)0x0;
            }
            else {
              sVar17 = strlen(__s);
              __dest = (char *)malloc(sVar17 + 1);
              strcpy(__dest,__s);
            }
            pNtk->pWLoadUsed = __dest;
          }
        }
        else {
          pSVar12 = Abc_SclFetchWireLoadModel(pLib,pNtk->pWLoadUsed);
          p->pWLoadUsed = pSVar12;
        }
      }
      Abc_SclTimeNtkRecompute(p,&p->SumArea0,&p->MaxDelay0,fDept,DUser);
      p->SumArea = p->SumArea0;
      p->MaxDelay = p->MaxDelay0;
      return p;
    }
  }
  __assert_fail("p->pCostsFlt == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                ,0x61,"void Vec_QueSetPriority(Vec_Que_t *, float **)");
}

Assistant:

SC_Man * Abc_SclManStart( SC_Lib * pLib, Abc_Ntk_t * pNtk, int fUseWireLoads, int fDept, float DUser, int nTreeCRatio )
{
    SC_Man * p = Abc_SclManAlloc( pLib, pNtk );
    if ( nTreeCRatio )
    {
        p->EstLoadMax = 0.01 * nTreeCRatio;  // max ratio of Cout/Cave when the estimation is used
        p->EstLinear  = 100;                  // linear coefficient
    }
    Abc_SclMioGates2SclGates( pLib, pNtk );
    Abc_SclManReadSlewAndLoad( p, pNtk );
    if ( fUseWireLoads )
    {
        if ( pNtk->pWLoadUsed == NULL )
        {            
            p->pWLoadUsed = Abc_SclFindWireLoadModel( pLib, Abc_SclGetTotalArea(p->pNtk) );
            if ( p->pWLoadUsed )
            pNtk->pWLoadUsed = Abc_UtilStrsav( p->pWLoadUsed->pName );
        }
        else
            p->pWLoadUsed = Abc_SclFetchWireLoadModel( pLib, pNtk->pWLoadUsed );
    }
    Abc_SclTimeNtkRecompute( p, &p->SumArea0, &p->MaxDelay0, fDept, DUser );
    p->SumArea  = p->SumArea0;
    p->MaxDelay = p->MaxDelay0;
    return p;
}